

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result __thiscall
testing::internal::
FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
::Invoke(FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
        vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
        *args_1,vector<unsigned_char,_std::allocator<unsigned_char>_> *args_2)

{
  UntypedActionResultHolderBase *pUVar1;
  long lVar2;
  bool bVar3;
  ArgumentTuple tuple;
  GTestLog local_24;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_20;
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_20 = args_2;
  local_18 = args_1;
  local_10 = args;
  pUVar1 = UntypedFunctionMockerBase::UntypedInvokeWith
                     (&this->super_UntypedFunctionMockerBase,&local_20);
  if (pUVar1 == (UntypedActionResultHolderBase *)0x0) {
    bVar3 = true;
  }
  else {
    lVar2 = __dynamic_cast(pUVar1,&UntypedActionResultHolderBase::typeinfo,
                           &ActionResultHolder<void>::typeinfo,0);
    bVar3 = lVar2 != 0;
  }
  bVar3 = IsTrue(bVar3);
  if (!bVar3) {
    GTestLog::GTestLog(&local_24,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/googletest/repo/googletest/include/gtest/internal/gtest-port.h"
                       ,0x44d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Condition f == nullptr || dynamic_cast<To>(f) != nullptr failed. ",0x41);
    GTestLog::~GTestLog(&local_24);
  }
  if (pUVar1 != (UntypedActionResultHolderBase *)0x0) {
    (*pUVar1->_vptr_UntypedActionResultHolderBase[1])(pUVar1);
  }
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }